

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderAtomicOpTests.cpp
# Opt level: O3

int __thiscall
deqp::gles31::Functional::ShaderAtomicCompSwapCase::init
          (ShaderAtomicCompSwapCase *this,EVP_PKEY_CTX *ctx)

{
  RenderContext *renderCtx;
  int iVar1;
  char *pcVar2;
  char *__s;
  ostream *poVar3;
  size_t sVar4;
  ShaderProgram *pSVar5;
  TestError *this_00;
  long lVar6;
  char *pcVar7;
  ostringstream src;
  undefined1 auStack_2c8 [4];
  AtomicOperandType local_2c4;
  long *local_2c0;
  long local_2b8;
  long local_2b0 [2];
  undefined1 local_2a0 [376];
  uint local_128;
  value_type local_120;
  undefined1 local_100 [144];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_70;
  undefined1 local_50 [32];
  
  local_2c4 = this->m_operandType;
  pcVar2 = glu::getPrecisionName(this->m_precision);
  __s = glu::getDataTypeName(this->m_type);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2a0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a0,"#version 310 es\n",0x10);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_2a0,"layout(local_size_x = ",0x16);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)local_2a0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,", local_size_y = ",0x11);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,", local_size_z = ",0x11);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,") in;\n",6);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,"layout(binding = 0) buffer InOut\n",0x21);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"{\n",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\t",1);
  if (pcVar2 == (char *)0x0) {
    std::ios::clear((int)poVar3->_vptr_basic_ostream[-3] + (int)poVar3);
  }
  else {
    sVar4 = strlen(pcVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar2,sVar4);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
  if (__s == (char *)0x0) {
    std::ios::clear((int)poVar3 + (int)poVar3->_vptr_basic_ostream[-3]);
  }
  else {
    sVar4 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,__s,sVar4);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," compareValues[",0xf);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"];\n",3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\t",1);
  if (pcVar2 == (char *)0x0) {
    std::ios::clear((int)poVar3->_vptr_basic_ostream[-3] + (int)poVar3);
  }
  else {
    sVar4 = strlen(pcVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar2,sVar4);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
  if (__s == (char *)0x0) {
    std::ios::clear((int)poVar3 + (int)poVar3->_vptr_basic_ostream[-3]);
  }
  else {
    sVar4 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,__s,sVar4);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," exchangeValues[",0x10);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"];\n",3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\t",1);
  if (pcVar2 == (char *)0x0) {
    std::ios::clear((int)poVar3->_vptr_basic_ostream[-3] + (int)poVar3);
  }
  else {
    sVar4 = strlen(pcVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar2,sVar4);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
  if (__s == (char *)0x0) {
    std::ios::clear((int)poVar3 + (int)poVar3->_vptr_basic_ostream[-3]);
  }
  else {
    sVar4 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,__s,sVar4);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," outputValues[",0xe);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"];\n",3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\t",1);
  pcVar7 = glcts::fixed_sample_locations_values + 1;
  if (local_2c4 == ATOMIC_OPERAND_BUFFER_VARIABLE) {
    pcVar7 = "coherent ";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,pcVar7,(ulong)(local_2c4 == ATOMIC_OPERAND_BUFFER_VARIABLE) * 9);
  if (pcVar2 == (char *)0x0) {
    std::ios::clear((int)poVar3 + (int)poVar3->_vptr_basic_ostream[-3]);
  }
  else {
    sVar4 = strlen(pcVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar2,sVar4);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
  if (__s == (char *)0x0) {
    std::ios::clear((int)poVar3 + (int)poVar3->_vptr_basic_ostream[-3]);
  }
  else {
    sVar4 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,__s,sVar4);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," groupValues[",0xd);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"];\n",3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"} sb_inout;\n",0xc);
  if (local_2c4 != ATOMIC_OPERAND_BUFFER_VARIABLE) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a0,"shared ",7);
    if (pcVar2 == (char *)0x0) {
      std::ios::clear((int)auStack_2c8 + (int)*(_func_int **)(local_2a0._0_8_ + -0x18) + 0x28);
    }
    else {
      sVar4 = strlen(pcVar2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a0,pcVar2,sVar4);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a0," ",1);
    if (__s == (char *)0x0) {
      std::ios::clear((int)auStack_2c8 + (int)*(_func_int **)(local_2a0._0_8_ + -0x18) + 0x28);
    }
    else {
      sVar4 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a0,__s,sVar4);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a0," s_var;\n",8);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a0,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a0,"void main (void)\n",0x11)
  ;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a0,"{\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_2a0,
             "\tuint localSize  = gl_WorkGroupSize.x*gl_WorkGroupSize.y*gl_WorkGroupSize.z;\n",0x4d)
  ;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_2a0,
             "\tuint globalNdx  = gl_NumWorkGroups.x*gl_NumWorkGroups.y*gl_WorkGroupID.z + gl_NumWorkGroups.x*gl_WorkGroupID.y + gl_WorkGroupID.x;\n"
             ,0x84);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_2a0,"\tuint globalOffs = localSize*globalNdx;\n",0x28);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_2a0,"\tuint offset     = globalOffs + gl_LocalInvocationIndex;\n",0x39
            );
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a0,"\n",1);
  if (local_2c4 != ATOMIC_OPERAND_BUFFER_VARIABLE) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_2a0,"\tif (gl_LocalInvocationIndex == 0u)\n",0x24);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a0,"\t\ts_var = ",10);
    if (__s == (char *)0x0) {
      std::ios::clear((int)auStack_2c8 + (int)*(_func_int **)(local_2a0._0_8_ + -0x18) + 0x28);
    }
    else {
      sVar4 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a0,__s,sVar4);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a0,"(",1);
    poVar3 = (ostream *)std::ostream::operator<<(local_2a0,0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,");\n",3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a0,"\t",1);
  if (pcVar2 == (char *)0x0) {
    std::ios::clear((int)auStack_2c8 + (int)*(_func_int **)(local_2a0._0_8_ + -0x18) + 0x28);
  }
  else {
    sVar4 = strlen(pcVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a0,pcVar2,sVar4);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a0," ",1);
  if (__s == (char *)0x0) {
    std::ios::clear((int)auStack_2c8 + (int)*(_func_int **)(local_2a0._0_8_ + -0x18) + 0x28);
  }
  else {
    sVar4 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a0,__s,sVar4);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_2a0," compare = sb_inout.compareValues[offset];\n",0x2b);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a0,"\t",1);
  if (pcVar2 == (char *)0x0) {
    std::ios::clear((int)auStack_2c8 + (int)*(_func_int **)(local_2a0._0_8_ + -0x18) + 0x28);
  }
  else {
    sVar4 = strlen(pcVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a0,pcVar2,sVar4);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a0," ",1);
  if (__s == (char *)0x0) {
    std::ios::clear((int)auStack_2c8 + (int)*(_func_int **)(local_2a0._0_8_ + -0x18) + 0x28);
  }
  else {
    sVar4 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a0,__s,sVar4);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_2a0," exchange = sb_inout.exchangeValues[offset];\n",0x2d);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a0,"\t",1);
  if (pcVar2 == (char *)0x0) {
    std::ios::clear((int)auStack_2c8 + (int)*(_func_int **)(local_2a0._0_8_ + -0x18) + 0x28);
  }
  else {
    sVar4 = strlen(pcVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a0,pcVar2,sVar4);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a0," ",1);
  if (__s == (char *)0x0) {
    std::ios::clear((int)auStack_2c8 + (int)*(_func_int **)(local_2a0._0_8_ + -0x18) + 0x28);
  }
  else {
    sVar4 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a0,__s,sVar4);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a0," result;\n",9);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_2a0,"\tbool swapDone = false;\n",0x18);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a0,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_2a0,"\tfor (uint ndx = 0u; ndx < localSize; ndx++)\n",0x2d);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a0,"\t{\n",3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a0,"\t\tbarrier();\n",0xd);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_2a0,"\t\tif (!swapDone)\n",0x11);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a0,"\t\t{\n",4);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_2a0,"\t\t\tresult = atomicCompSwap(",0x1b);
  pcVar2 = "s_var";
  if (local_2c4 == ATOMIC_OPERAND_BUFFER_VARIABLE) {
    pcVar2 = "sb_inout.groupValues[globalNdx]";
  }
  lVar6 = 5;
  if (local_2c4 == ATOMIC_OPERAND_BUFFER_VARIABLE) {
    lVar6 = 0x1f;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a0,pcVar2,lVar6);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_2a0,", compare, exchange);\n",0x16);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_2a0,"\t\t\tif (result == compare)\n",0x1a);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_2a0,"\t\t\t\tswapDone = true;\n",0x15);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a0,"\t\t}\n",4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a0,"\t}\n",3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a0,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_2a0,"\tsb_inout.outputValues[offset] = result;\n",0x29);
  if (local_2c4 != ATOMIC_OPERAND_BUFFER_VARIABLE) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a0,"\tbarrier();\n",0xc);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_2a0,"\tif (gl_LocalInvocationIndex == 0u)\n",0x24);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_2a0,"\t\tsb_inout.groupValues[globalNdx] = s_var;\n",0x2b);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a0,"}\n",2);
  pSVar5 = (ShaderProgram *)operator_new(0xd0);
  renderCtx = ((this->super_TestCase).m_context)->m_renderCtx;
  memset(local_100,0,0xac);
  local_50._0_8_ = (pointer)0x0;
  local_50[8] = 0;
  local_50._9_7_ = 0;
  local_50[0x10] = 0;
  local_50._17_8_ = 0;
  std::__cxx11::stringbuf::str();
  local_128 = 5;
  local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_120,local_2c0,local_2b8 + (long)local_2c0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_100 + (ulong)local_128 * 0x18),&local_120);
  glu::ShaderProgram::ShaderProgram(pSVar5,renderCtx,(ProgramSources *)local_100);
  this->m_program = pSVar5;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != &local_120.field_2) {
    operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
  }
  if (local_2c0 != local_2b0) {
    operator_delete(local_2c0,local_2b0[0] + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_50);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_70);
  lVar6 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_100 + lVar6));
    lVar6 = lVar6 + -0x18;
  } while (lVar6 != -0x18);
  glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                  this->m_program);
  pSVar5 = this->m_program;
  if ((pSVar5->m_program).m_info.linkOk != false) {
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2a0);
    iVar1 = std::ios_base::~ios_base((ios_base *)(local_2a0 + 0x70));
    return iVar1;
  }
  glu::ShaderProgram::~ShaderProgram(pSVar5);
  operator_delete(pSVar5,0xd0);
  this->m_program = (ShaderProgram *)0x0;
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  local_100._0_8_ = local_100 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"Compile failed","");
  tcu::TestError::TestError(this_00,(string *)local_100);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void ShaderAtomicCompSwapCase::init (void)
{
	const bool			isSSBO		= m_operandType == ATOMIC_OPERAND_BUFFER_VARIABLE;
	const char*			precName	= getPrecisionName(m_precision);
	const char*			typeName	= getDataTypeName(m_type);
	const deUint32		numValues	= product(m_workGroupSize)*product(m_numWorkGroups);
	std::ostringstream	src;

	src << "#version 310 es\n"
		<< "layout(local_size_x = " << m_workGroupSize.x()
		<< ", local_size_y = " << m_workGroupSize.y()
		<< ", local_size_z = " << m_workGroupSize.z() << ") in;\n"
		<< "layout(binding = 0) buffer InOut\n"
		<< "{\n"
		<< "	" << precName << " " << typeName << " compareValues[" << numValues << "];\n"
		<< "	" << precName << " " << typeName << " exchangeValues[" << numValues << "];\n"
		<< "	" << precName << " " << typeName << " outputValues[" << numValues << "];\n"
		<< "	" << (isSSBO ? "coherent " : "") << precName << " " << typeName << " groupValues[" << product(m_numWorkGroups) << "];\n"
		<< "} sb_inout;\n";

	if (!isSSBO)
		src << "shared " << precName << " " << typeName << " s_var;\n";

	src << "\n"
		<< "void main (void)\n"
		<< "{\n"
		<< "	uint localSize  = gl_WorkGroupSize.x*gl_WorkGroupSize.y*gl_WorkGroupSize.z;\n"
		<< "	uint globalNdx  = gl_NumWorkGroups.x*gl_NumWorkGroups.y*gl_WorkGroupID.z + gl_NumWorkGroups.x*gl_WorkGroupID.y + gl_WorkGroupID.x;\n"
		<< "	uint globalOffs = localSize*globalNdx;\n"
		<< "	uint offset     = globalOffs + gl_LocalInvocationIndex;\n"
		<< "\n";

	if (!isSSBO)
	{
		src << "	if (gl_LocalInvocationIndex == 0u)\n"
			<< "		s_var = " << typeName << "(" << 0 << ");\n"
			<< "\n";
	}

	src << "	" << precName << " " << typeName << " compare = sb_inout.compareValues[offset];\n"
		<< "	" << precName << " " << typeName << " exchange = sb_inout.exchangeValues[offset];\n"
		<< "	" << precName << " " << typeName << " result;\n"
		<< "	bool swapDone = false;\n"
		<< "\n"
		<< "	for (uint ndx = 0u; ndx < localSize; ndx++)\n"
		<< "	{\n"
		<< "		barrier();\n"
		<< "		if (!swapDone)\n"
		<< "		{\n"
		<< "			result = atomicCompSwap(" << (isSSBO ? "sb_inout.groupValues[globalNdx]" : "s_var") << ", compare, exchange);\n"
		<< "			if (result == compare)\n"
		<< "				swapDone = true;\n"
		<< "		}\n"
		<< "	}\n"
		<< "\n"
		<< "	sb_inout.outputValues[offset] = result;\n";

	if (!isSSBO)
	{
		src << "	barrier();\n"
			<< "	if (gl_LocalInvocationIndex == 0u)\n"
			<< "		sb_inout.groupValues[globalNdx] = s_var;\n";
	}

	src << "}\n";

	DE_ASSERT(!m_program);
	m_program = new ShaderProgram(m_context.getRenderContext(), ProgramSources() << ComputeSource(src.str()));

	m_testCtx.getLog() << *m_program;

	if (!m_program->isOk())
	{
		delete m_program;
		m_program = DE_NULL;
		throw tcu::TestError("Compile failed");
	}
}